

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLoader.c
# Opt level: O1

UINT8 FileLoader_dopen(void *context)

{
  FILE *__stream;
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  UINT8 fileHdr [4];
  UINT8 sizeBuffer [4];
  char local_20 [4];
  uint local_1c;
  
  __stream = fopen(*(char **)((long)context + 0x10),"rb");
  *(FILE **)((long)context + 8) = __stream;
  if (__stream != (FILE *)0x0) {
    sVar1 = fread(local_20,1,4,__stream);
    if (sVar1 < 4) {
      memset(local_20 + sVar1,0,4 - sVar1);
    }
    if ((local_20[0] != '\x1f') || (local_20[1] != -0x75)) {
      fseek(*(FILE **)((long)context + 8),0,2);
      lVar3 = ftell(*(FILE **)((long)context + 8));
      *(int *)((long)context + 4) = (int)lVar3;
      rewind(*(FILE **)((long)context + 8));
      *(undefined1 *)context = 0;
      *(code **)((long)context + 0x18) = FileLoader_ReadRaw;
      *(code **)((long)context + 0x20) = FileLoader_SeekRaw;
      *(code **)((long)context + 0x28) = FileLoader_CloseRaw;
      *(code **)((long)context + 0x30) = FileLoader_TellRaw;
      *(code **)((long)context + 0x38) = FileLoader_EofRaw;
      return '\0';
    }
    fseek(*(FILE **)((long)context + 8),-4,2);
    fread(&local_1c,4,1,*(FILE **)((long)context + 8));
    *(uint *)((long)context + 4) = local_1c;
    uVar2 = ftell(*(FILE **)((long)context + 8));
    if (local_1c < ((uint)(uVar2 >> 1) & 0x7fffffff)) {
      *(undefined4 *)((long)context + 4) = 0;
    }
    fclose(*(FILE **)((long)context + 8));
    *(undefined8 *)((long)context + 8) = 0;
    lVar3 = gzopen(*(undefined8 *)((long)context + 0x10),"rb");
    *(long *)((long)context + 8) = lVar3;
    if (lVar3 != 0) {
      *(undefined1 *)context = 0x10;
      *(code **)((long)context + 0x18) = FileLoader_ReadGZ;
      *(code **)((long)context + 0x20) = FileLoader_SeekGZ;
      *(code **)((long)context + 0x28) = FileLoader_CloseGZ;
      *(code **)((long)context + 0x30) = FileLoader_TellGZ;
      *(code **)((long)context + 0x38) = FileLoader_EofGZ;
      return '\0';
    }
  }
  return '\x01';
}

Assistant:

static UINT8 FileLoader_dopen(void *context)
{
	FILE_LOADER *loader = (FILE_LOADER *)context;
	UINT8 fileHdr[4];
	size_t readBytes;

#if HAVE_FILELOADER_W
	if (loader->fileName == NULL)
		loader->hLoad.hFileRaw = _wfopen(loader->fileNameW, L"rb");
	else
#endif
		loader->hLoad.hFileRaw = fopen(loader->fileName, "rb");
	if (loader->hLoad.hFileRaw == NULL) return 0x01;

	readBytes = fread(fileHdr, 0x01, 4, loader->hLoad.hFileRaw);
	if (readBytes < 4)
		memset(&fileHdr[readBytes], 0x00, 4 - readBytes);

	if (fileHdr[0] == 31 && fileHdr[1] == 139)	// check for .gz file header
	{
		UINT8 sizeBuffer[4];
		fseek(loader->hLoad.hFileRaw, -4, SEEK_END);
		fread(sizeBuffer, 0x04, 0x01, loader->hLoad.hFileRaw);
		loader->bytesTotal = ReadLE32(sizeBuffer);
		if (loader->bytesTotal < (UINT32)ftell(loader->hLoad.hFileRaw) / 2)
			loader->bytesTotal = 0;
		fclose(loader->hLoad.hFileRaw);
		loader->hLoad.hFileRaw = NULL;

#if HAVE_FILELOADER_W
		if (loader->fileName == NULL)
			loader->hLoad.hFileGZ = gzopen_w(loader->fileNameW, "rb");
		else
#endif
			loader->hLoad.hFileGZ = gzopen(loader->fileName, "rb");
		if (loader->hLoad.hFileGZ == NULL)
			return 0x01;	// TODO: separate error code for "invalid .gz file"
		loader->modeCompr = FLMODE_CMP_GZ;
		loader->Read = &FileLoader_ReadGZ;
		loader->Seek = &FileLoader_SeekGZ;
		loader->Close = &FileLoader_CloseGZ;
		loader->Tell = &FileLoader_TellGZ;
		loader->Eof = &FileLoader_EofGZ;
		return 0x00;
	}

	fseek(loader->hLoad.hFileRaw, 0, SEEK_END);
	loader->bytesTotal = ftell(loader->hLoad.hFileRaw);
	rewind(loader->hLoad.hFileRaw);

	loader->modeCompr = FLMODE_CMP_RAW;
	loader->Read = &FileLoader_ReadRaw;
	loader->Seek = &FileLoader_SeekRaw;
	loader->Close = &FileLoader_CloseRaw;
	loader->Tell = &FileLoader_TellRaw;
	loader->Eof = &FileLoader_EofRaw;

	return 0x00;
}